

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInExtensions(Generator *this)

{
  FileDescriptor *pFVar1;
  long lVar2;
  long lVar3;
  
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x88)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      FixForeignFieldsInExtension(this,(FieldDescriptor *)(*(long *)(pFVar1 + 0x98) + lVar2));
      lVar3 = lVar3 + 1;
      pFVar1 = this->file_;
      lVar2 = lVar2 + 0xa8;
    } while (lVar3 < *(int *)(pFVar1 + 0x88));
  }
  if (0 < *(int *)(pFVar1 + 0x58)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      FixForeignFieldsInNestedExtensions(this,(Descriptor *)(*(long *)(pFVar1 + 0x60) + lVar2));
      lVar3 = lVar3 + 1;
      pFVar1 = this->file_;
      lVar2 = lVar2 + 0xa8;
    } while (lVar3 < *(int *)(pFVar1 + 0x58));
  }
  io::Printer::Print(this->printer_,"\n");
  return;
}

Assistant:

void Generator::FixForeignFieldsInExtensions() const {
  // Top-level extensions.
  for (int i = 0; i < file_->extension_count(); ++i) {
    FixForeignFieldsInExtension(*file_->extension(i));
  }
  // Nested extensions.
  for (int i = 0; i < file_->message_type_count(); ++i) {
    FixForeignFieldsInNestedExtensions(*file_->message_type(i));
  }
  printer_->Print("\n");
}